

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2151.c
# Opt level: O0

void refresh_EG(YM2151Operator *op)

{
  uint uVar1;
  uint uVar2;
  UINT32 v;
  UINT32 kc;
  YM2151Operator *op_local;
  
  uVar2 = op->kc;
  uVar1 = uVar2 >> ((byte)op->ks & 0x1f);
  if (op->ar + uVar1 < 0x5e) {
    op->eg_sh_ar = ""[op->ar + uVar1];
    op->eg_sel_ar = eg_rate_select[op->ar + uVar1];
  }
  else {
    op->eg_sh_ar = '\0';
    op->eg_sel_ar = 0x88;
  }
  op->eg_sh_d1r = ""[op->d1r + uVar1];
  op->eg_sel_d1r = eg_rate_select[op->d1r + uVar1];
  op->eg_sh_d2r = ""[op->d2r + uVar1];
  op->eg_sel_d2r = eg_rate_select[op->d2r + uVar1];
  op->eg_sh_rr = ""[op->rr + uVar1];
  op->eg_sel_rr = eg_rate_select[op->rr + uVar1];
  uVar1 = uVar2 >> ((byte)op[1].ks & 0x1f);
  if (op[1].ar + uVar1 < 0x5e) {
    op[1].eg_sh_ar = ""[op[1].ar + uVar1];
    op[1].eg_sel_ar = eg_rate_select[op[1].ar + uVar1];
  }
  else {
    op[1].eg_sh_ar = '\0';
    op[1].eg_sel_ar = 0x88;
  }
  op[1].eg_sh_d1r = ""[op[1].d1r + uVar1];
  op[1].eg_sel_d1r = eg_rate_select[op[1].d1r + uVar1];
  op[1].eg_sh_d2r = ""[op[1].d2r + uVar1];
  op[1].eg_sel_d2r = eg_rate_select[op[1].d2r + uVar1];
  op[1].eg_sh_rr = ""[op[1].rr + uVar1];
  op[1].eg_sel_rr = eg_rate_select[op[1].rr + uVar1];
  uVar1 = uVar2 >> ((byte)op[2].ks & 0x1f);
  if (op[2].ar + uVar1 < 0x5e) {
    op[2].eg_sh_ar = ""[op[2].ar + uVar1];
    op[2].eg_sel_ar = eg_rate_select[op[2].ar + uVar1];
  }
  else {
    op[2].eg_sh_ar = '\0';
    op[2].eg_sel_ar = 0x88;
  }
  op[2].eg_sh_d1r = ""[op[2].d1r + uVar1];
  op[2].eg_sel_d1r = eg_rate_select[op[2].d1r + uVar1];
  op[2].eg_sh_d2r = ""[op[2].d2r + uVar1];
  op[2].eg_sel_d2r = eg_rate_select[op[2].d2r + uVar1];
  op[2].eg_sh_rr = ""[op[2].rr + uVar1];
  op[2].eg_sel_rr = eg_rate_select[op[2].rr + uVar1];
  uVar2 = uVar2 >> ((byte)op[3].ks & 0x1f);
  if (op[3].ar + uVar2 < 0x5e) {
    op[3].eg_sh_ar = ""[op[3].ar + uVar2];
    op[3].eg_sel_ar = eg_rate_select[op[3].ar + uVar2];
  }
  else {
    op[3].eg_sh_ar = '\0';
    op[3].eg_sel_ar = 0x88;
  }
  op[3].eg_sh_d1r = ""[op[3].d1r + uVar2];
  op[3].eg_sel_d1r = eg_rate_select[op[3].d1r + uVar2];
  op[3].eg_sh_d2r = ""[op[3].d2r + uVar2];
  op[3].eg_sel_d2r = eg_rate_select[op[3].d2r + uVar2];
  op[3].eg_sh_rr = ""[op[3].rr + uVar2];
  op[3].eg_sel_rr = eg_rate_select[op[3].rr + uVar2];
  return;
}

Assistant:

INLINE void refresh_EG(YM2151Operator * op)
{
	UINT32 kc;
	UINT32 v;

	kc = op->kc;

	/* v = 32 + 2*RATE + RKS = max 126 */

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];


	op+=1;

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];

	op+=1;

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];

	op+=1;

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];
}